

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O0

bool __thiscall cppjieba::HMMModel::LoadEmitProb(HMMModel *this,string *line,EmitProbMap *mp)

{
  bool bVar1;
  ulong uVar2;
  allocator<char> *paVar3;
  Logger *this_00;
  size_type sVar4;
  ostream *poVar5;
  size_t sVar6;
  char *__nptr;
  char *in_RSI;
  size_t i;
  Unicode unicode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tmp;
  Unicode *in_stack_fffffffffffffb98;
  LocalVector<unsigned_int> *in_stack_fffffffffffffba0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbb0;
  allocator<char> *in_stack_fffffffffffffbd0;
  allocator<char> *__a;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  int in_stack_fffffffffffffc2c;
  char *in_stack_fffffffffffffc30;
  size_t in_stack_fffffffffffffc38;
  Logger *in_stack_fffffffffffffc40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  Logger local_290;
  allocator<char> local_109;
  string local_108 [32];
  allocator<char> *local_e8;
  undefined1 local_d9 [49];
  LocalVector<unsigned_int> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  char *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x14cc6c);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x14cc79);
    limonp::LocalVector<unsigned_int>::LocalVector((LocalVector<unsigned_int> *)0x14cc86);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,local_18,in_stack_fffffffffffffbd0);
    limonp::Split(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                  (string *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::__cxx11::string::~string((string *)(local_d9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d9);
    local_e8 = (allocator<char> *)0x0;
    __s = local_18;
    while (__a = local_e8,
          paVar3 = (allocator<char> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_38), __a < paVar3) {
      this_00 = (Logger *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_38,(size_type)local_e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
      limonp::Split(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                    (string *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator(&local_109);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_50);
      if (sVar4 != 2) {
        limonp::Logger::Logger
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                   in_stack_fffffffffffffc2c);
        poVar5 = limonp::Logger::Stream(&local_290);
        std::operator<<(poVar5,"emitProb illegal.");
        limonp::Logger::~Logger(this_00);
        local_1 = 0;
        goto LAB_0014d07b;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_50,0);
      bVar1 = DecodeRunesInString((string *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      if ((!bVar1) || (sVar6 = limonp::LocalVector<unsigned_int>::size(&local_a8), sVar6 != 1)) {
        limonp::Logger::Logger
                  (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                   in_stack_fffffffffffffc2c);
        poVar5 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffffbe8);
        std::operator<<(poVar5,"TransCode failed.");
        limonp::Logger::~Logger(this_00);
        local_1 = 0;
        goto LAB_0014d07b;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_50,1);
      __nptr = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffba0 = (LocalVector<unsigned_int> *)atof(__nptr);
      limonp::LocalVector<unsigned_int>::operator[](&local_a8,0);
      in_stack_fffffffffffffbb0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)std::
              unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              ::operator[]((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                            *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98->buffer_);
      (in_stack_fffffffffffffbb0->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffba0;
      local_e8 = local_e8 + 1;
    }
    local_1 = 1;
LAB_0014d07b:
    limonp::LocalVector<unsigned_int>::~LocalVector(in_stack_fffffffffffffba0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffbb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffbb0);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool LoadEmitProb(const string& line, EmitProbMap& mp) {
    if (line.empty()) {
      return false;
    }
    vector<string> tmp, tmp2;
    Unicode unicode;
    Split(line, tmp, ",");
    for (size_t i = 0; i < tmp.size(); i++) {
      Split(tmp[i], tmp2, ":");
      if (2 != tmp2.size()) {
        XLOG(ERROR) << "emitProb illegal.";
        return false;
      }
      if (!DecodeRunesInString(tmp2[0], unicode) || unicode.size() != 1) {
        XLOG(ERROR) << "TransCode failed.";
        return false;
      }
      mp[unicode[0]] = atof(tmp2[1].c_str());
    }
    return true;
  }